

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestStartCommand::InitialPass
          (cmCTestStartCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  ulong uVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  int mode;
  pointer pbVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  pointer pbVar9;
  pointer local_488;
  pointer local_480;
  char *local_478;
  string local_470;
  string sourceDir;
  string binaryDir;
  string startLogFile;
  cmGeneratedFileStream ofs;
  ostringstream cmCTestLog_msg_3;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 == pbVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"called with incorrect number of arguments",
               (allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
LAB_0017f432:
    std::__cxx11::string::~string((string *)&ofs);
    return false;
  }
  uVar8 = 0;
  local_478 = (char *)0x0;
  local_488 = (pointer)0x0;
  local_480 = (pointer)0x0;
  while (uVar8 < (ulong)((long)pbVar5 - (long)pbVar9 >> 5)) {
    bVar4 = std::operator==(pbVar9 + uVar8,"TRACK");
    if (bVar4) {
      uVar1 = uVar8 + 1;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (uVar1 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)) {
        bVar4 = std::operator==(pbVar9 + uVar1,"APPEND");
        if ((!bVar4) &&
           (bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar1,"QUIET"),
           !bVar4)) {
          cmCTest::SetSpecificTrack
                    ((this->super_cmCTestCommand).CTest,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_dataplus._M_p);
          uVar8 = uVar8 + 2;
          goto LAB_0017f0af;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofs,"TRACK argument missing track name",
                 (allocator<char> *)&cmCTestLog_msg_3);
      cmCommand::SetError((cmCommand *)this,(string *)&ofs);
      goto LAB_0017f432;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"APPEND");
    if (bVar4) {
      uVar8 = uVar8 + 1;
      this->CreateNewTag = false;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar8,"QUIET");
      if (bVar4) {
        uVar8 = uVar8 + 1;
        this->Quiet = true;
      }
      else {
        if (local_478 == (char *)0x0) {
          local_478 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
        }
        else if (local_488 == (pointer)0x0) {
          local_488 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
        }
        else {
          if (local_480 != (pointer)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ofs,"Too many arguments",(allocator<char> *)&cmCTestLog_msg_3);
            cmCommand::SetError((cmCommand *)this,(string *)&ofs);
            goto LAB_0017f432;
          }
          local_480 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
        }
        uVar8 = uVar8 + 1;
      }
    }
LAB_0017f0af:
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (local_488 == (pointer)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"CTEST_SOURCE_DIRECTORY",(allocator<char> *)&cmCTestLog_msg_3);
    local_488 = cmMakefile::GetDefinition(pcVar2,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
  }
  if (local_480 == (pointer)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"CTEST_BINARY_DIRECTORY",(allocator<char> *)&cmCTestLog_msg_3);
    local_480 = cmMakefile::GetDefinition(pcVar2,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
  }
  if (local_488 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,
               "source directory not specified. Specify source directory as an argument or set CTEST_SOURCE_DIRECTORY"
               ,(allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
    goto LAB_0017f432;
  }
  if (local_480 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,
               "binary directory not specified. Specify binary directory as an argument or set CTEST_BINARY_DIRECTORY"
               ,(allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
    goto LAB_0017f432;
  }
  if ((local_478 == (char *)0x0) && (this->CreateNewTag == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,
               "no test model specified and APPEND not specified. Specify either a test model or the APPEND argument"
               ,(allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
    goto LAB_0017f432;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,local_488,(allocator<char> *)&cmCTestLog_msg_3);
  cmsys::SystemTools::AddKeepPath((string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,local_480,(allocator<char> *)&cmCTestLog_msg_3);
  cmsys::SystemTools::AddKeepPath((string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  cmCTest::EmptyCTestConfiguration((this->super_cmCTestCommand).CTest);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,local_488,(allocator<char> *)&cmCTestLog_msg_3);
  cmsys::SystemTools::CollapseFullPath(&sourceDir,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,local_480,(allocator<char> *)&cmCTestLog_msg_3);
  cmsys::SystemTools::CollapseFullPath(&binaryDir,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"SourceDirectory",sourceDir._M_dataplus._M_p,
             this->Quiet);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"BuildDirectory",binaryDir._M_dataplus._M_p,
             this->Quiet);
  if (local_478 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,"Run dashboard with to-be-determined model");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Source directory: ");
    poVar6 = std::operator<<(poVar6,local_488);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Build directory: ");
    poVar6 = std::operator<<(poVar6,local_480);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x72,_cmCTestLog_msg_3,this->Quiet);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,"Run dashboard with model ");
    poVar6 = std::operator<<(poVar6,local_478);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Source directory: ");
    poVar6 = std::operator<<(poVar6,local_488);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Build directory: ");
    poVar6 = std::operator<<(poVar6,local_480);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x6a,_cmCTestLog_msg_3,this->Quiet);
  }
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  pcVar7 = cmCTest::GetSpecificTrack((this->super_cmCTestCommand).CTest);
  if (pcVar7 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,"   Track: ");
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x77,_cmCTestLog_msg_3,this->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  }
  std::operator+(&startLogFile,&binaryDir,"/Testing/Temporary/LastStart.log");
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs,&startLogFile,false,None);
  if (((&ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    bVar4 = InitialCheckout(this,(ostream *)&ofs,&sourceDir);
    if (bVar4) {
      bVar4 = cmsys::SystemTools::FileIsDirectory(&sourceDir);
      if (bVar4) {
        cmCTest::SetRunCurrentScript((this->super_cmCTestCommand).CTest,false);
        cmCTest::SetSuppressUpdatingCTestConfiguration((this->super_cmCTestCommand).CTest,true);
        if (local_478 == (char *)0x0) {
          mode = -1;
        }
        else {
          mode = cmCTest::GetTestModelFromString(local_478);
        }
        cmCTest::SetTestModel((this->super_cmCTestCommand).CTest,mode);
        cmCTest::SetProduceXML((this->super_cmCTestCommand).CTest,true);
        bVar4 = cmCTest::InitializeFromCommand((this->super_cmCTestCommand).CTest,this);
        goto LAB_0017f6c9;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"given source path\n");
      poVar6 = std::operator<<(poVar6,"  ");
      poVar6 = std::operator<<(poVar6,(string *)&sourceDir);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"which is not an existing directory.  ");
      std::operator<<(poVar6,"Set CTEST_CHECKOUT_COMMAND to a command line to create it.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_470);
      goto LAB_0017f654;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Cannot create log file: LastStart.log");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x7f,local_470._M_dataplus._M_p,false);
LAB_0017f654:
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
  }
  bVar4 = false;
LAB_0017f6c9:
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  std::__cxx11::string::~string((string *)&startLogFile);
  std::__cxx11::string::~string((string *)&binaryDir);
  std::__cxx11::string::~string((string *)&sourceDir);
  return bVar4;
}

Assistant:

bool cmCTestStartCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  size_t cnt = 0;
  const char* smodel = nullptr;
  const char* src_dir = nullptr;
  const char* bld_dir = nullptr;

  while (cnt < args.size()) {
    if (args[cnt] == "TRACK") {
      cnt++;
      if (cnt >= args.size() || args[cnt] == "APPEND" ||
          args[cnt] == "QUIET") {
        this->SetError("TRACK argument missing track name");
        return false;
      }
      this->CTest->SetSpecificTrack(args[cnt].c_str());
      cnt++;
    } else if (args[cnt] == "APPEND") {
      cnt++;
      this->CreateNewTag = false;
    } else if (args[cnt] == "QUIET") {
      cnt++;
      this->Quiet = true;
    } else if (!smodel) {
      smodel = args[cnt].c_str();
      cnt++;
    } else if (!src_dir) {
      src_dir = args[cnt].c_str();
      cnt++;
    } else if (!bld_dir) {
      bld_dir = args[cnt].c_str();
      cnt++;
    } else {
      this->SetError("Too many arguments");
      return false;
    }
  }

  if (!src_dir) {
    src_dir = this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY");
  }
  if (!bld_dir) {
    bld_dir = this->Makefile->GetDefinition("CTEST_BINARY_DIRECTORY");
  }
  if (!src_dir) {
    this->SetError("source directory not specified. Specify source directory "
                   "as an argument or set CTEST_SOURCE_DIRECTORY");
    return false;
  }
  if (!bld_dir) {
    this->SetError("binary directory not specified. Specify binary directory "
                   "as an argument or set CTEST_BINARY_DIRECTORY");
    return false;
  }
  if (!smodel && this->CreateNewTag) {
    this->SetError("no test model specified and APPEND not specified. Specify "
                   "either a test model or the APPEND argument");
    return false;
  }

  cmSystemTools::AddKeepPath(src_dir);
  cmSystemTools::AddKeepPath(bld_dir);

  this->CTest->EmptyCTestConfiguration();

  std::string sourceDir = cmSystemTools::CollapseFullPath(src_dir);
  std::string binaryDir = cmSystemTools::CollapseFullPath(bld_dir);
  this->CTest->SetCTestConfiguration("SourceDirectory", sourceDir.c_str(),
                                     this->Quiet);
  this->CTest->SetCTestConfiguration("BuildDirectory", binaryDir.c_str(),
                                     this->Quiet);

  if (smodel) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with model "
                         << smodel << std::endl
                         << "   Source directory: " << src_dir << std::endl
                         << "   Build directory: " << bld_dir << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with "
                       "to-be-determined model"
                         << std::endl
                         << "   Source directory: " << src_dir << std::endl
                         << "   Build directory: " << bld_dir << std::endl,
                       this->Quiet);
  }
  const char* track = this->CTest->GetSpecificTrack();
  if (track) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Track: " << track << std::endl, this->Quiet);
  }

  // Log startup actions.
  std::string startLogFile = binaryDir + "/Testing/Temporary/LastStart.log";
  cmGeneratedFileStream ofs(startLogFile);
  if (!ofs) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: LastStart.log" << std::endl);
    return false;
  }

  // Make sure the source directory exists.
  if (!this->InitialCheckout(ofs, sourceDir)) {
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDir)) {
    std::ostringstream e;
    e << "given source path\n"
      << "  " << sourceDir << "\n"
      << "which is not an existing directory.  "
      << "Set CTEST_CHECKOUT_COMMAND to a command line to create it.";
    this->SetError(e.str());
    return false;
  }

  this->CTest->SetRunCurrentScript(false);
  this->CTest->SetSuppressUpdatingCTestConfiguration(true);
  int model;
  if (smodel) {
    model = cmCTest::GetTestModelFromString(smodel);
  } else {
    model = cmCTest::UNKNOWN;
  }
  this->CTest->SetTestModel(model);
  this->CTest->SetProduceXML(true);

  return this->CTest->InitializeFromCommand(this);
}